

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall QThreadPool::setMaxThreadCount(QThreadPool *this,int maxThreadCount)

{
  long lVar1;
  QThreadPoolPrivate *pQVar2;
  int in_ESI;
  long in_FS_OFFSET;
  QThreadPoolPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffa8;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffb0;
  QThreadPoolPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QThreadPool *)0x6cc419);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (in_ESI != pQVar2->requestedMaxThreadCount) {
    pQVar2->requestedMaxThreadCount = in_ESI;
    QThreadPoolPrivate::tryToStartMoreThreads(in_stack_ffffffffffffffc0);
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QThreadPool::setMaxThreadCount(int maxThreadCount)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);

    if (maxThreadCount == d->requestedMaxThreadCount)
        return;

    d->requestedMaxThreadCount = maxThreadCount;
    d->tryToStartMoreThreads();
}